

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFrames.c
# Opt level: O1

void Gia_ManFraStop(Gia_ManFra_t *p)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  long lVar3;
  
  pVVar1 = p->vIns;
  if (0 < pVVar1->nSize) {
    lVar3 = 0;
    do {
      pvVar2 = pVVar1->pArray[lVar3];
      if (pvVar2 != (void *)0x0) {
        if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar2 + 8));
          *(undefined8 *)((long)pvVar2 + 8) = 0;
        }
        free(pvVar2);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar1->nSize);
  }
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vAnds;
  if (0 < pVVar1->nSize) {
    lVar3 = 0;
    do {
      pvVar2 = pVVar1->pArray[lVar3];
      if (pvVar2 != (void *)0x0) {
        if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar2 + 8));
          *(undefined8 *)((long)pvVar2 + 8) = 0;
        }
        free(pvVar2);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar1->nSize);
  }
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vOuts;
  if (0 < pVVar1->nSize) {
    lVar3 = 0;
    do {
      pvVar2 = pVVar1->pArray[lVar3];
      if (pvVar2 != (void *)0x0) {
        if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar2 + 8));
          *(undefined8 *)((long)pvVar2 + 8) = 0;
        }
        free(pvVar2);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar1->nSize);
  }
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  if (p != (Gia_ManFra_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Gia_ManFraStop( Gia_ManFra_t * p )  
{
    Vec_VecFree( (Vec_Vec_t *)p->vIns );
    Vec_VecFree( (Vec_Vec_t *)p->vAnds );
    Vec_VecFree( (Vec_Vec_t *)p->vOuts );
    ABC_FREE( p );
}